

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O1

void hmm_init(hmm_context_t *ctx,hmm_t *hmm,int mpx,int ssid,int tmatid)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  
  hmm->ctx = ctx;
  hmm->mpx = (uint8)mpx;
  uVar2 = ctx->n_emit_state;
  hmm->n_emit_state = (uint8)uVar2;
  if (mpx == 0) {
    hmm->ssid = (uint16)ssid;
    memcpy(hmm->senid,ctx->sseq[ssid],(ulong)((uVar2 & 0xff) * 2));
  }
  else {
    hmm->ssid = 0xffff;
    hmm->senid[0] = (uint16)ssid;
    if (1 < (uVar2 & 0xff)) {
      memset(hmm->senid + 1,0xff,(ulong)((uVar2 & 0xff) - 1) * 2);
    }
  }
  hmm->tmatid = (int16)tmatid;
  hmm->score[0] = -0x20000000;
  hmm->history[0] = -1;
  bVar1 = hmm->n_emit_state;
  if (1 < (ulong)bVar1) {
    lVar3 = 0;
    do {
      hmm->score[lVar3 + 1] = -0x20000000;
      hmm->history[lVar3 + 1] = -1;
      lVar3 = lVar3 + 1;
    } while ((ulong)bVar1 - 1 != lVar3);
  }
  hmm->out_score = -0x20000000;
  hmm->out_history = -1;
  hmm->bestscore = -0x20000000;
  hmm->frame = -1;
  return;
}

Assistant:

void
hmm_init(hmm_context_t *ctx, hmm_t *hmm, int mpx, int ssid, int tmatid)
{
    hmm->ctx = ctx;
    hmm->mpx = mpx;
    hmm->n_emit_state = ctx->n_emit_state;
    if (mpx) {
        int i;
        hmm->ssid = BAD_SSID;
        hmm->senid[0] = ssid;
        for (i = 1; i < hmm_n_emit_state(hmm); ++i) {
            hmm->senid[i] = BAD_SSID;
        }
    }
    else {
        hmm->ssid = ssid;
        memcpy(hmm->senid, ctx->sseq[ssid], hmm->n_emit_state * sizeof(*hmm->senid));
    }
    hmm->tmatid = tmatid;
    hmm_clear(hmm);
}